

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void net_create_demon(Am_Object *self)

{
  Am_Value *this;
  code *pcVar1;
  char c;
  char local_21;
  Am_Object local_20;
  
  this = Am_Object::Get(self,Am_CREATE_DEMON,1);
  pcVar1 = (code *)Am_Value::operator_cast_to_void_(this);
  if (pcVar1 != (code *)0x0) {
    std::operator>>((istream *)&std::cin,&local_21);
    Am_Object::Am_Object(&local_20,self);
    (*pcVar1)(&local_20);
    Am_Object::~Am_Object(&local_20);
  }
  return;
}

Assistant:

void
net_create_demon(Am_Object self)
{
  Am_Object_Demon *proto_create =
      (Am_Object_Demon *)(Am_Ptr)self.Peek(Am_CREATE_DEMON);
  if (proto_create != nullptr) {
    char c;
    std::cin >> c;
    proto_create(self); // Call prototype create demon.
  }
  // Do my own code.
}